

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sparc.h
# Opt level: O0

char * SPARCCondCodeToString(sparc_cc CC)

{
  char *pcStack_10;
  sparc_cc CC_local;
  
  switch(CC) {
  case SPARC_CC_ICC_N:
    pcStack_10 = "n";
    break;
  case SPARC_CC_ICC_E:
    pcStack_10 = "e";
    break;
  case SPARC_CC_ICC_LE:
    pcStack_10 = "le";
    break;
  case SPARC_CC_ICC_L:
    pcStack_10 = "l";
    break;
  case SPARC_CC_ICC_LEU:
    pcStack_10 = "leu";
    break;
  case SPARC_CC_ICC_CS:
    pcStack_10 = "cs";
    break;
  case SPARC_CC_ICC_NEG:
    pcStack_10 = "neg";
    break;
  case SPARC_CC_ICC_VS:
    pcStack_10 = "vs";
    break;
  case SPARC_CC_ICC_A:
    pcStack_10 = "a";
    break;
  case SPARC_CC_ICC_NE:
    pcStack_10 = "ne";
    break;
  case SPARC_CC_ICC_G:
    pcStack_10 = "g";
    break;
  case SPARC_CC_ICC_GE:
    pcStack_10 = "ge";
    break;
  case SPARC_CC_ICC_GU:
    pcStack_10 = "gu";
    break;
  case SPARC_CC_ICC_CC:
    pcStack_10 = "cc";
    break;
  case SPARC_CC_ICC_POS:
    pcStack_10 = "pos";
    break;
  case SPARC_CC_ICC_VC:
    pcStack_10 = "vc";
    break;
  case SPARC_CC_FCC_N:
    pcStack_10 = "n";
    break;
  case SPARC_CC_FCC_NE:
    pcStack_10 = "ne";
    break;
  case SPARC_CC_FCC_LG:
    pcStack_10 = "lg";
    break;
  case SPARC_CC_FCC_UL:
    pcStack_10 = "ul";
    break;
  case SPARC_CC_FCC_L:
    pcStack_10 = "l";
    break;
  case SPARC_CC_FCC_UG:
    pcStack_10 = "ug";
    break;
  case SPARC_CC_FCC_G:
    pcStack_10 = "g";
    break;
  case SPARC_CC_FCC_U:
    pcStack_10 = "u";
    break;
  case SPARC_CC_FCC_A:
    pcStack_10 = "a";
    break;
  case SPARC_CC_FCC_E:
    pcStack_10 = "e";
    break;
  case SPARC_CC_FCC_UE:
    pcStack_10 = "ue";
    break;
  case SPARC_CC_FCC_GE:
    pcStack_10 = "ge";
    break;
  case SPARC_CC_FCC_UGE:
    pcStack_10 = "uge";
    break;
  case SPARC_CC_FCC_LE:
    pcStack_10 = "le";
    break;
  case SPARC_CC_FCC_ULE:
    pcStack_10 = "ule";
    break;
  case SPARC_CC_FCC_O:
    pcStack_10 = "o";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

inline static char *SPARCCondCodeToString(sparc_cc CC)
{
	switch (CC) {
		default:	return NULL;	// unreachable
		case SPARC_CC_ICC_A:  return "a";
		case SPARC_CC_ICC_N:   return "n";
		case SPARC_CC_ICC_NE:  return "ne";
		case SPARC_CC_ICC_E:   return "e";
		case SPARC_CC_ICC_G:   return "g";
		case SPARC_CC_ICC_LE:  return "le";
		case SPARC_CC_ICC_GE:  return "ge";
		case SPARC_CC_ICC_L:   return "l";
		case SPARC_CC_ICC_GU:  return "gu";
		case SPARC_CC_ICC_LEU: return "leu";
		case SPARC_CC_ICC_CC:  return "cc";
		case SPARC_CC_ICC_CS:  return "cs";
		case SPARC_CC_ICC_POS: return "pos";
		case SPARC_CC_ICC_NEG: return "neg";
		case SPARC_CC_ICC_VC:  return "vc";
		case SPARC_CC_ICC_VS:  return "vs";

		case SPARC_CC_FCC_A:   return "a";
		case SPARC_CC_FCC_N:   return "n";
		case SPARC_CC_FCC_U:   return "u";
		case SPARC_CC_FCC_G:   return "g";
		case SPARC_CC_FCC_UG:  return "ug";
		case SPARC_CC_FCC_L:   return "l";
		case SPARC_CC_FCC_UL:  return "ul";
		case SPARC_CC_FCC_LG:  return "lg";
		case SPARC_CC_FCC_NE:  return "ne";
		case SPARC_CC_FCC_E:   return "e";
		case SPARC_CC_FCC_UE:  return "ue";
		case SPARC_CC_FCC_GE:  return "ge";
		case SPARC_CC_FCC_UGE: return "uge";
		case SPARC_CC_FCC_LE:  return "le";
		case SPARC_CC_FCC_ULE: return "ule";
		case SPARC_CC_FCC_O:   return "o";
	}
}